

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_utilities.hpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
Disa::level_traversal<Disa::Adjacency_Graph<false>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,Disa *this,
          Adjacency_Graph<false> *graph,size_t i_start,size_t end_level)

{
  ostream *poVar1;
  ulong uVar2;
  Adjacency_Graph<false> *__n;
  unsigned_long __val;
  initializer_list<unsigned_long> __l;
  string sStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> vertex_queue;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  undefined **local_28;
  
  uVar2 = *(long *)(this + 0x20) - *(long *)(this + 0x18);
  if ((uVar2 == 0) || (uVar2 < 9)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
    local_78._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)&PTR_s__workspace_llm4binary_github_lic_001575b8;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vertex_queue,
               (Disa *)0x0,(Log_Level)&local_78,(source_location *)i_start);
    poVar1 = std::operator<<(poVar1,(string *)&vertex_queue);
    poVar1 = std::operator<<(poVar1,"Graph is empty.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    __n = (Adjacency_Graph<false> *)(((long)uVar2 >> 3) + -1);
    if (graph < __n) {
      vertex_queue.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)0xffffffffffffffff;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (__return_storage_ptr__,(size_type)__n,(value_type_conflict *)&vertex_queue,
                 (allocator_type *)&local_78);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_e8;
      local_e8._M_dataplus._M_p = (pointer)graph;
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque
                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,__l,
                 (allocator_type *)&sStack_108);
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_Deque_base
                ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&vertex_queue,
                 &local_78);
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_78);
      (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl.super__Vector_impl_data._M_start[(long)graph] = 0;
      level_traversal<Disa::Adjacency_Graph<false>>
                ((Adjacency_Graph<false> *)this,&vertex_queue,__return_storage_ptr__,i_start);
      std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&vertex_queue);
      return __return_storage_ptr__;
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
    local_28 = &PTR_s__workspace_llm4binary_github_lic_001575d0;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vertex_queue,
               (Disa *)0x0,(Log_Level)&local_28,(source_location *)i_start);
    poVar1 = std::operator<<(poVar1,(string *)&vertex_queue);
    __val = 0;
    if (*(long *)(this + 0x20) != *(long *)(this + 0x18)) {
      __val = (*(long *)(this + 0x20) - *(long *)(this + 0x18) >> 3) - 1;
    }
    std::__cxx11::to_string(&sStack_108,__val);
    std::operator+(&local_e8,"Starting vertex not in range (0, ",&sStack_108);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                   &local_e8,"].");
    poVar1 = std::operator<<(poVar1,(string *)&local_78);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&sStack_108);
  }
  std::__cxx11::string::~string((string *)&vertex_queue);
  exit(1);
}

Assistant:

std::vector<std::size_t> level_traversal(const _graph& graph, const std::size_t i_start,
                                         const std::size_t end_level = std::numeric_limits<std::size_t>::max()) {

  ASSERT_DEBUG(!graph.empty(), "Graph is empty.");
  ASSERT_DEBUG(i_start < graph.size_vertex(),
               "Starting vertex not in range (0, " + std::to_string(graph.size_vertex()) + "].");

  std::vector<std::size_t> vertex_level(graph.size_vertex(), std::numeric_limits<std::size_t>::max());
  std::queue<std::size_t> vertex_queue({i_start});
  vertex_level[i_start] = 0;
  level_traversal(graph, vertex_queue, vertex_level, end_level);
  return vertex_level;
}